

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void QUnicodeTools::Tailored::indicAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t uc;
  char16_t uc_00;
  uint uVar1;
  Form FVar2;
  Form FVar3;
  Form FVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  long lStack_60;
  
  lVar6 = 0;
  do {
    lVar5 = len - lVar6;
    if (lVar5 == 0 || len < lVar6) {
      return;
    }
    uc = text[from + lVar6];
    FVar3 = form(uc);
    if ((FVar3 == IndependentVowel) || (lStack_60 = 1, FVar3 == Consonant)) {
      lVar7 = 1;
      if (lVar5 < 2) {
        lVar5 = lVar7;
      }
      for (; lStack_60 = lVar5, lVar5 != lVar7; lVar7 = lVar7 + 1) {
        uc_00 = text[from + lVar6 + lVar7];
        FVar4 = form(uc_00);
        lStack_60 = lVar7;
        FVar2 = FVar4;
        switch(FVar4) {
        case Invalid:
        case IndependentVowel:
        case Other:
          goto switchD_003047e6_caseD_0;
        case Consonant:
          if ((FVar3 != Halant) ||
             ((FVar2 = Consonant, script == Script_Sinhala &&
              (text[from + lVar6 + lVar7 + -1] != L'\x200d')))) goto switchD_003047e6_caseD_0;
          break;
        case Nukta:
          FVar2 = Nukta;
          if (FVar3 != Consonant) goto switchD_003047e6_caseD_0;
          break;
        case Halant:
          FVar2 = Halant;
          if (1 < FVar3 - Consonant) {
            if (lVar7 == 1 && script == Script_Bengali) {
              FVar2 = Halant;
              if ((uc != L'অ') && (uc != L'এ')) {
                lStack_60 = 1;
                goto switchD_003047e6_caseD_0;
              }
            }
            else if (((script != Script_Sinhala) || (FVar2 = Matra, FVar3 != Matra)) &&
                    ((script != Script_Malayalam ||
                     ((FVar3 != Matra || (FVar2 = Matra, text[from + lVar6 + lVar7 + -1] != L'ു'))
                     )))) goto switchD_003047e6_caseD_0;
          }
          break;
        case Matra:
          if (FVar3 < VowelMark) {
            uVar1 = 0x16;
LAB_00304850:
            if ((uVar1 >> (FVar3 & 0x1f) & 1) != 0) break;
          }
LAB_00304994:
          if (((script != Script_Bengali) || (uc_00 != L'া')) ||
             (FVar2 = FVar4, text[from + lVar6 + lVar7 + -1] != L'অ'))
          goto switchD_003047e6_caseD_0;
          break;
        case VowelMark:
          if (LengthMark < FVar3) goto LAB_00304994;
          if ((400U >> (FVar3 & 0x1f) & 1) == 0) {
            uVar1 = 6;
            goto LAB_00304850;
          }
          break;
        case StressMark:
          if ((LengthMark < FVar3) ||
             ((((400U >> (FVar3 & 0x1f) & 1) == 0 && ((6U >> (FVar3 & 0x1f) & 1) == 0)) &&
              (FVar2 = StressMark, FVar3 != VowelMark)))) goto LAB_00304994;
          break;
        case LengthMark:
          FVar2 = LengthMark;
          if (FVar3 != Matra) goto switchD_003047e6_caseD_0;
          break;
        case Control:
          if (FVar3 != Halant) {
            if ((script == Script_Bengali) && (FVar3 == Consonant)) {
              if (uc_00 == L'\x200d') {
                bVar8 = text[from + lVar6 + lVar7 + -1] == L'র';
LAB_00304955:
                FVar2 = Consonant;
                if (bVar8) break;
              }
            }
            else if ((script == Script_Kannada) && ((FVar3 == Consonant && (uc_00 == L'\x200d')))) {
              bVar8 = text[from + lVar6 + lVar7 + -1] == L'ರ';
              goto LAB_00304955;
            }
LAB_003049e9:
            lStack_60 = lVar7 + 1;
            goto switchD_003047e6_caseD_0;
          }
          FVar2 = Halant;
          if (uc_00 != L'\x200d') goto LAB_003049e9;
        }
        FVar3 = FVar2;
      }
    }
switchD_003047e6_caseD_0:
    attributes[lVar6 + from] = (QCharAttributes)((byte)attributes[lVar6 + from] | 1);
    lVar5 = lStack_60 + lVar6;
    if (len <= lStack_60 + lVar6) {
      lVar5 = len;
    }
    while (lVar6 = lVar6 + 1, lVar6 < lVar5) {
      attributes[lVar6 + from] = (QCharAttributes)((byte)attributes[lVar6 + from] & 0xfe);
    }
  } while( true );
}

Assistant:

static void indicAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    attributes += from;
    qsizetype i = 0;
    while (i < len) {
        bool invalid;
        qsizetype boundary = indic_nextSyllableBoundary(script, text, from+i, end, &invalid) - from;
         attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }


}